

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void xmlListPopFront(xmlListPtr l)

{
  _xmlLink *p_Var1;
  _xmlLink *p_Var2;
  xmlLinkPtr pxVar3;
  
  if ((l != (xmlListPtr)0x0) && (pxVar3 = l->sentinel->next, pxVar3 != l->sentinel)) {
    p_Var1 = pxVar3->next;
    p_Var2 = pxVar3->prev;
    p_Var2->next = p_Var1;
    p_Var1->prev = p_Var2;
    if (l->linkDeallocator != (_func_void_xmlLinkPtr *)0x0) {
      (*l->linkDeallocator)(pxVar3);
    }
    (*xmlFree)(pxVar3);
    return;
  }
  return;
}

Assistant:

int
xmlListEmpty(xmlListPtr l)
{
    if (l == NULL)
        return(-1);
    return (l->sentinel->next == l->sentinel);
}